

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identification_strategy.cpp
# Opt level: O1

LCC_EVENT_TYPE __thiscall
license::hw_identifier::IdentificationStrategy::validate_identifier
          (IdentificationStrategy *this,HwIdentifier *identifier)

{
  bool bVar1;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar2;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar3;
  LCC_EVENT_TYPE LVar4;
  HwIdentifier *it;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  available_ids;
  vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
  local_40;
  
  LVar2 = HwIdentifier::get_identification_strategy(identifier);
  LVar3 = (*this->_vptr_IdentificationStrategy[2])(this);
  LVar4 = IDENTIFIERS_MISMATCH;
  if (LVar2 == LVar3) {
    (*this->_vptr_IdentificationStrategy[4])(&local_40,this);
    LVar4 = IDENTIFIERS_MISMATCH;
    if (local_40.
        super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_40.
        super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar1 = operator==(local_40.
                           super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
                           ._M_impl.super__Vector_impl_data._M_start,identifier);
        if (bVar1) {
          LVar4 = LICENSE_OK;
        }
        local_40.
        super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_40.
             super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      } while (local_40.
               super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_40.
               super__Vector_base<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
               ._M_impl.super__Vector_impl_data._M_finish && !bVar1);
    }
    std::
    vector<license::hw_identifier::HwIdentifier,_std::allocator<license::hw_identifier::HwIdentifier>_>
    ::~vector(&local_40);
  }
  return LVar4;
}

Assistant:

LCC_EVENT_TYPE IdentificationStrategy::validate_identifier(const HwIdentifier& identifier) const {
	LCC_EVENT_TYPE result = IDENTIFIERS_MISMATCH;

	if (identifier.get_identification_strategy() == identification_strategy()) {
		const vector<HwIdentifier> available_ids = alternative_ids();
		for (const auto& it : available_ids) {
			if (it == identifier) {
				result = LICENSE_OK;
				break;
			}
		}
	}
	return result;
}